

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSEngine.cpp
# Opt level: O2

void __thiscall PSEngine::load_level_internal(PSEngine *this,int p_level_idx)

{
  __weak_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer pCVar2;
  element_type *peVar3;
  long lVar4;
  ulong uVar5;
  pointer pCVar6;
  ulong uVar7;
  __weak_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2> *p_Var8;
  undefined1 local_148 [8];
  undefined1 auStack_140 [8];
  undefined1 local_138 [16];
  pointer local_128;
  pointer local_120;
  _Base_ptr local_118;
  Level compiled_level;
  string local_e8;
  vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_> *local_c0;
  ulong local_b8;
  weak_ptr<CompiledGame::PrimaryObject> obj;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50 [32];
  
  if ((ulong)(long)p_level_idx <
      (ulong)((long)(this->m_compiled_game).levels.
                    super__Vector_base<CompiledGame::Level,_std::allocator<CompiledGame::Level>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_compiled_game).levels.
                    super__Vector_base<CompiledGame::Level,_std::allocator<CompiledGame::Level>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 5)) {
    std::vector<PSEngine::Level,_std::allocator<PSEngine::Level>_>::clear
              (&this->m_level_state_stack);
    this->m_is_level_won = false;
    this->m_current_tick_time_elapsed = 0.0;
    CompiledGame::Level::Level
              (&compiled_level,
               (this->m_compiled_game).levels.
               super__Vector_base<CompiledGame::Level,_std::allocator<CompiledGame::Level>_>._M_impl
               .super__Vector_impl_data._M_start + p_level_idx);
    auStack_140 = (undefined1  [8])0x0;
    local_148._0_4_ = -1;
    local_148._4_4_ = 0;
    local_138._0_8_ = (pointer)0x0;
    local_138._8_8_ = (pointer)0x0;
    local_128 = (pointer)0x0;
    Level::operator=(&this->m_current_level,(Level *)local_148);
    std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>::~vector
              ((vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_> *)local_138);
    (this->m_current_level).level_idx = p_level_idx;
    (this->m_current_level).size.x = compiled_level.width;
    (this->m_current_level).size.y = compiled_level.height;
    local_c0 = &(this->m_current_level).cells;
    uVar7 = 0;
    while( true ) {
      pCVar6 = compiled_level.cells.
               super__Vector_base<CompiledGame::Cell,_std::allocator<CompiledGame::Cell>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)(((long)compiled_level.cells.
                         super__Vector_base<CompiledGame::Cell,_std::allocator<CompiledGame::Cell>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)compiled_level.cells.
                        super__Vector_base<CompiledGame::Cell,_std::allocator<CompiledGame::Cell>_>.
                        _M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar7) break;
      local_138._0_8_ = (pointer)0x0;
      local_138._8_8_ = (pointer)0x0;
      local_148._0_4_ = 0;
      local_148._4_4_ = 0;
      auStack_140 = (undefined1  [8])0x0;
      local_128 = (pointer)local_138;
      local_118 = (_Base_ptr)0x0;
      local_120 = local_128;
      std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>::emplace_back<PSEngine::Cell>
                (local_c0,(Cell *)local_148);
      std::
      _Rb_tree<std::shared_ptr<CompiledGame::PrimaryObject>,_std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>,_std::_Select1st<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>,_std::less<std::shared_ptr<CompiledGame::PrimaryObject>_>,_std::allocator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<CompiledGame::PrimaryObject>,_std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>,_std::_Select1st<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>,_std::less<std::shared_ptr<CompiledGame::PrimaryObject>_>,_std::allocator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>_>
                   *)auStack_140);
      lVar4 = (long)(this->m_current_level).size.x;
      uVar5 = (ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff;
      (this->m_current_level).cells.
      super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>._M_impl.
      super__Vector_impl_data._M_finish[-1].position =
           (PSVector2i)((long)uVar5 % lVar4 & 0xffffffffU | (long)uVar5 / lVar4 << 0x20);
      p_Var1 = &(pCVar6[uVar7].objects.
                 super__Vector_base<std::weak_ptr<CompiledGame::PrimaryObject>,_std::allocator<std::weak_ptr<CompiledGame::PrimaryObject>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->
                super___weak_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2>;
      local_b8 = uVar7;
      for (p_Var8 = &(pCVar6[uVar7].objects.
                      super__Vector_base<std::weak_ptr<CompiledGame::PrimaryObject>,_std::allocator<std::weak_ptr<CompiledGame::PrimaryObject>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                     super___weak_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2>;
          p_Var8 != p_Var1; p_Var8 = p_Var8 + 1) {
        std::__weak_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
                  (&obj.super___weak_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2>,
                   p_Var8);
        pCVar2 = (this->m_current_level).cells.
                 super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        std::__shared_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2> *)
                   &local_e8,
                   &obj.super___weak_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2>);
        local_148 = (undefined1  [8])local_e8._M_dataplus._M_p;
        auStack_140 = (undefined1  [8])local_e8._M_string_length;
        local_e8._M_dataplus._M_p = (pointer)0x0;
        local_e8._M_string_length = 0;
        local_138._0_4_ = 6;
        std::
        _Rb_tree<std::shared_ptr<CompiledGame::PrimaryObject>,std::pair<std::shared_ptr<CompiledGame::PrimaryObject>const,PSEngine::ObjectMoveType>,std::_Select1st<std::pair<std::shared_ptr<CompiledGame::PrimaryObject>const,PSEngine::ObjectMoveType>>,std::less<std::shared_ptr<CompiledGame::PrimaryObject>>,std::allocator<std::pair<std::shared_ptr<CompiledGame::PrimaryObject>const,PSEngine::ObjectMoveType>>>
        ::
        _M_emplace_unique<std::pair<std::shared_ptr<CompiledGame::PrimaryObject>,PSEngine::ObjectMoveType>>
                  ((_Rb_tree<std::shared_ptr<CompiledGame::PrimaryObject>,std::pair<std::shared_ptr<CompiledGame::PrimaryObject>const,PSEngine::ObjectMoveType>,std::_Select1st<std::pair<std::shared_ptr<CompiledGame::PrimaryObject>const,PSEngine::ObjectMoveType>>,std::less<std::shared_ptr<CompiledGame::PrimaryObject>>,std::allocator<std::pair<std::shared_ptr<CompiledGame::PrimaryObject>const,PSEngine::ObjectMoveType>>>
                    *)&pCVar2[-1].objects,
                   (pair<std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType> *)
                   local_148);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_140);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_e8._M_string_length);
        std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                  (&obj.super___weak_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      uVar7 = local_b8 + 1;
    }
    std::vector<CompiledGame::Cell,_std::allocator<CompiledGame::Cell>_>::~vector
              (&compiled_level.cells);
  }
  else if ((int)(this->m_config).log_verbosity < 5) {
    peVar3 = (this->m_logger).super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string(local_50,(string *)&m_engine_log_cat_abi_cxx11_);
    std::__cxx11::to_string(&local_e8,p_level_idx);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&obj,
                   "Cannot load level ",&local_e8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &compiled_level,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&obj,
                   ", there\'s only ");
    std::__cxx11::to_string
              (&local_90,
               (long)(this->m_compiled_game).levels.
                     super__Vector_base<CompiledGame::Level,_std::allocator<CompiledGame::Level>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_compiled_game).levels.
                     super__Vector_base<CompiledGame::Level,_std::allocator<CompiledGame::Level>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 5);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &compiled_level,&local_90);
    std::operator+(&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                   " levels.");
    (*peVar3->_vptr_PSLogger[2])(peVar3,4,local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)local_148);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&compiled_level);
    std::__cxx11::string::~string((string *)&obj);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string(local_50);
    if ((this->m_config).log_operation_history_after_error == true) {
      print_operation_history(this);
    }
  }
  return;
}

Assistant:

void PSEngine::load_level_internal(int p_level_idx)
{
    if(p_level_idx >= m_compiled_game.levels.size())
    {
        PS_LOG_ERROR("Cannot load level "+to_string(p_level_idx)+", there's only "+to_string(m_compiled_game.levels.size())+" levels.");
        return;
    }
    m_level_state_stack.clear();
    m_is_level_won = false;
    m_current_tick_time_elapsed = 0;

    CompiledGame::Level compiled_level = m_compiled_game.levels[p_level_idx];

    m_current_level = Level();

    m_current_level.level_idx = p_level_idx;
    m_current_level.size = PSVector2i(compiled_level.width, compiled_level.height);


    for(int i = 0; i < compiled_level.cells.size(); ++i)
    {
        const auto& cell = compiled_level.cells[i];

        m_current_level.cells.push_back(Cell());

        m_current_level.cells.back().position = PSVector2i( i % m_current_level.size.x, i / m_current_level.size.x);

        for(weak_ptr<CompiledGame::PrimaryObject> obj : cell.objects)
        {
            m_current_level.cells.back().objects.insert(make_pair(obj.lock(),ObjectMoveType::Stationary));
        }
    }
}